

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86internal.cpp
# Opt level: O3

Error asmjit::X86Internal::emitRegMove
                (X86Emitter *emitter,Operand_ *dst_,Operand_ *src_,uint32_t typeId,bool avxEnabled,
                char *comment)

{
  byte bVar1;
  Reg *pRVar2;
  Error EVar3;
  uint uVar4;
  undefined4 uVar5;
  uint32_t uVar6;
  uint uVar7;
  undefined4 in_register_0000000c;
  uint32_t (*pauVar8) [2];
  ulong uVar9;
  undefined4 uVar10;
  uint uVar11;
  ulong extraout_RDX;
  ulong uVar12;
  uint32_t uVar13;
  undefined7 in_register_00000081;
  char cVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  byte bVar20;
  bool bVar21;
  Operand dst;
  Operand src;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_108;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_f8;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_e8;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_d8;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_c0;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_b0;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_70;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_60;
  anon_union_16_7_ed616b9d_for_Operand__0 local_28;
  anon_union_16_7_ed616b9d_for_Operand__0 local_18;
  
  cVar14 = (char)comment;
  uVar9 = CONCAT71(in_register_00000081,avxEnabled);
  pauVar8 = (uint32_t (*) [2])CONCAT44(in_register_0000000c,typeId);
  if ((0xffffffba < typeId - 0x65) && ((typeId & 0x7e) != 0x20)) {
    local_28._packed[0] = (UInt64)*(undefined8 *)&dst_->field_0;
    local_28._mem.field_2 = (dst_->field_0)._mem.field_2;
    local_18._packed[0] = (UInt64)*(undefined8 *)&src_->field_0;
    local_18._mem.field_2 = (src_->field_0)._mem.field_2;
    bVar20 = (local_28._any.signature & 7) == 2;
    uVar10 = local_28._any.signature;
    if ((bool)bVar20) {
      uVar10 = local_28._any.signature & 0xfffffa | local_18._any.signature & 0xff000000;
      local_28._any.signature = uVar10;
    }
    if ((local_18._any.signature & 7) == 2) {
      bVar20 = bVar20 | 2;
      local_18._any.signature = local_18._any.signature & 0xfffffa | uVar10 & 0xff000000;
    }
    uVar13 = 0x189;
    switch(typeId) {
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
      if ((bVar20 & 2) == 0) {
        if (bVar20 == 0) {
          local_28._any.signature = 0x4000029;
          local_18._any.signature = 0x4000029;
        }
      }
      else {
        local_28._any.signature = 0x4000029;
      }
      break;
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
      break;
    default:
      bVar1 = TypeId::_info[(ulong)typeId + 0x80];
      if (bVar20 == 0 || 9 < typeId - 0x33) {
        if (9 < typeId - 0x3d || bVar20 == 0) {
          if (bVar1 == 0x2b) {
            uVar6 = 0x3dd;
            uVar13 = 0x18a;
          }
          else if (bVar1 == 0x2a) {
            uVar6 = 0x3de;
            uVar13 = 0x18b;
          }
          else {
            if (0x5a < typeId) {
              uVar13 = 0x3e3 - (bVar1 < 0x28);
              break;
            }
            uVar6 = 0x3e1;
            uVar13 = 400;
          }
          if (avxEnabled) {
            uVar13 = uVar6;
          }
          break;
        }
        uVar6 = 0x1a5;
        if (avxEnabled) {
          uVar6 = 0x3f6;
        }
        uVar13 = 0x1a2;
        if (avxEnabled) {
          uVar13 = 0x3f5;
        }
        bVar21 = bVar1 == 0x2b;
      }
      else {
        uVar6 = 0x1a8;
        if (avxEnabled) {
          uVar6 = 0x3f9;
        }
        uVar13 = 0x18d;
        if (avxEnabled) {
          uVar13 = 0x3df;
        }
        bVar21 = bVar1 == 0x2a;
      }
      if (bVar21) {
        uVar13 = uVar6;
      }
      break;
    case 0x2d:
      uVar13 = 0x13f;
      break;
    case 0x2e:
      uVar13 = 0x142;
      break;
    case 0x2f:
      uVar13 = 0x140;
      break;
    case 0x30:
      uVar13 = 0x141;
      break;
    case 0x31:
      uVar13 = 0x18d;
      if (bVar20 != 0) break;
    case 0x32:
      uVar13 = 0x1a2;
    }
    *(char **)(emitter + 0x40) = comment;
    EVar3 = CodeEmitter::emit((CodeEmitter *)emitter,uVar13,(Operand_ *)&local_28._any,
                              (Operand_ *)&local_18._any);
    return EVar3;
  }
  emitRegMove();
  uVar12 = extraout_RDX;
  if ((int)extraout_RDX == 0) {
    uVar12 = (ulong)(byte)x86OpData[(ulong)((((anon_union_16_7_ed616b9d_for_Operand__0 *)
                                             &((anon_struct_8_2_e7ed1743_for_UInt64_14 *)dst_)->
                                              u32Lo)->_any).signature >> 3 & 0x1f) + 0xa0];
  }
  uVar7 = (uint)uVar12;
  if ((0x44 < uVar7 - 0x20) || ((uVar7 & 0x7e) == 0x20)) {
    emitArgMove();
LAB_0012271c:
    emitArgMove();
    uVar7 = ((anon_struct_8_2_e7ed1743_for_UInt64_14 *)dst_)->u32Hi;
    pRVar2 = ((CodeEmitter *)emitter)->_nativeGpArray;
    aStack_108._packed[0] = *(UInt64 *)(pRVar2 + 4);
    aStack_108._mem.field_2 = pRVar2[4].super_Operand.super_Operand_.field_0._mem.field_2;
    aStack_e8._mem.field_2 = pRVar2[4].super_Operand.super_Operand_.field_0._mem.field_2;
    aStack_e8._any.signature =
         (uint32_t)*(undefined8 *)&pRVar2[4].super_Operand.super_Operand_.field_0;
    aStack_e8._any.id = 5;
    aStack_d8._packed[0] = (UInt64)((UInt64 *)(pRVar2 + 4))->field_11;
    aStack_d8._mem.field_2 = pRVar2[4].super_Operand.super_Operand_.field_0._mem.field_2;
    aStack_f8._packed[0] = (UInt64)((UInt64 *)(pRVar2 + 4))->field_11;
    aStack_f8._mem.field_2 = pRVar2[4].super_Operand.super_Operand_.field_0._mem.field_2;
    if ((((anon_struct_8_2_e7ed1743_for_UInt64_14 *)((long)dst_ + 0x10))->u32Hi & 1) != 0) {
      EVar3 = CodeEmitter::emit((CodeEmitter *)emitter,0x263,(Operand_ *)&aStack_e8._any);
      if (EVar3 != 0) {
        return EVar3;
      }
      EVar3 = CodeEmitter::emit((CodeEmitter *)emitter,0x189,(Operand_ *)&aStack_e8._any,
                                (Operand_ *)&aStack_108._any);
      if (EVar3 != 0) {
        return EVar3;
      }
      uVar7 = uVar7 & 0xffffffdf;
    }
    if (uVar7 != 0) {
      iVar19 = 0;
      do {
        if ((uVar7 & 1) != 0) {
          aStack_d8._any.id = iVar19;
          EVar3 = CodeEmitter::emit((CodeEmitter *)emitter,0x263,(Operand_ *)&aStack_d8._any);
          if (EVar3 != 0) {
            return EVar3;
          }
        }
        iVar19 = iVar19 + 1;
        bVar21 = 1 < uVar7;
        uVar7 = uVar7 >> 1;
      } while (bVar21);
    }
    cVar14 = *(char *)((long)&((anon_struct_8_2_e7ed1743_for_UInt64_14 *)dst_)->u32Lo + 2);
    if ((cVar14 != '\x04') && (cVar14 != -1)) {
      aStack_f8._any.id._0_1_ = cVar14;
      aStack_f8._any.id._1_3_ = 0;
      if (((cVar14 != '\x05') ||
          ((((anon_struct_8_2_e7ed1743_for_UInt64_14 *)((long)dst_ + 0x10))->u32Hi & 1) == 0)) &&
         (EVar3 = CodeEmitter::emit((CodeEmitter *)emitter,0x189,(Operand_ *)&aStack_f8._any,
                                    (Operand_ *)&aStack_108._any), EVar3 != 0)) {
        return EVar3;
      }
    }
    if ((((((anon_struct_8_2_e7ed1743_for_UInt64_14 *)((long)dst_ + 0x10))->u32Hi & 8) == 0) ||
        (EVar3 = CodeEmitter::emit((CodeEmitter *)emitter,0x15,(Operand_ *)&aStack_108._any,
                                   -(uint)*(byte *)&((anon_struct_8_2_e7ed1743_for_UInt64_14 *)dst_)
                                                    ->u32Lo), EVar3 == 0)) &&
       ((uVar9 = (ulong)(((anon_union_16_7_ed616b9d_for_Operand__0 *)
                         &((anon_struct_8_2_e7ed1743_for_UInt64_14 *)((long)dst_ + 0x20))->u32Lo)->
                        _any).signature, uVar9 == 0 ||
        (EVar3 = CodeEmitter::emit((CodeEmitter *)emitter,0x2c4,(Operand_ *)&aStack_108._any,uVar9),
        EVar3 == 0)))) {
      if ((~(byte)((anon_struct_8_2_e7ed1743_for_UInt64_14 *)((long)dst_ + 0x10))->u32Hi & 10) == 0)
      {
        aStack_c0._any.reserved8_4 =
             ((anon_struct_8_2_e7ed1743_for_UInt64_14 *)((long)dst_ + 0x28))->u32Lo;
        aStack_c0._packed[0] = (UInt64)((ulong)(aStack_108._any.signature & 0xf8) | 2);
        aStack_c0._any.reserved12_4 = aStack_108._any.id;
        EVar3 = CodeEmitter::emit((CodeEmitter *)emitter,0x189,(Operand_ *)&aStack_c0._any,
                                  (Operand_ *)&aStack_f8._any);
        if (EVar3 != 0) {
          return EVar3;
        }
      }
      if (((anon_struct_8_2_e7ed1743_for_UInt64_14 *)((long)dst_ + 8))->u32Lo != 0) {
        aStack_c0._any.reserved8_4 =
             ((anon_struct_8_2_e7ed1743_for_UInt64_14 *)((long)dst_ + 0x38))->u32Lo;
        aStack_c0._packed[0] = (UInt64)((ulong)(aStack_108._any.signature & 0xf8) | 2);
        aStack_c0._any.reserved12_4 = aStack_108._any.id;
        aStack_b0._packed[0] = (UInt64)0x10000149;
        aStack_b0._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0x0;
        bVar21 = (((anon_struct_8_2_e7ed1743_for_UInt64_14 *)((long)dst_ + 0x10))->u32Hi & 0x40) ==
                 0;
        uVar13 = 0x3de;
        if (bVar21) {
          uVar13 = 0x18b;
        }
        uVar6 = 0x3fb;
        if (bVar21) {
          uVar6 = 0x1ac;
        }
        if ((((anon_struct_8_2_e7ed1743_for_UInt64_14 *)((long)dst_ + 0x10))->u32Hi & 4) != 0) {
          uVar6 = uVar13;
        }
        iVar19 = 0;
        uVar7 = ((anon_struct_8_2_e7ed1743_for_UInt64_14 *)((long)dst_ + 8))->u32Lo;
        do {
          if ((uVar7 & 1) != 0) {
            aStack_b0._any.id = iVar19;
            EVar3 = CodeEmitter::emit((CodeEmitter *)emitter,uVar6,(Operand_ *)&aStack_c0._any,
                                      (Operand_ *)&aStack_b0._any);
            if (EVar3 != 0) {
              return EVar3;
            }
            aStack_c0._any.reserved8_4 = aStack_c0._any.reserved8_4 + 0x10;
          }
          iVar19 = iVar19 + 1;
          bVar21 = 1 < uVar7;
          uVar7 = uVar7 >> 1;
        } while (bVar21);
      }
      EVar3 = 0;
    }
    return EVar3;
  }
  uVar11 = (uint)uVar9;
  uVar4 = uVar11 - 0x20;
  if ((0x44 < uVar4) || ((uVar11 & 0x7e) == 0x20)) goto LAB_0012271c;
  aStack_60._packed[0] = (UInt64)*(undefined8 *)dst_;
  aStack_60._mem.field_2 = *(anon_union_8_2_78723da6_for_MemData_2 *)((long)dst_ + 8);
  aStack_70._packed[0] = (UInt64)*pauVar8;
  aStack_70._mem.field_2 = *(anon_union_8_2_78723da6_for_MemData_2 *)(pauVar8 + 1);
  bVar20 = TypeId::_info[uVar12 & 0xffffffff];
  bVar1 = TypeId::_info[uVar9 & 0xffffffff];
  uVar17 = (uint)bVar1;
  uVar15 = (uint)bVar20;
  uVar18 = (uint)bVar1;
  uVar16 = uVar17;
  if (uVar7 - 0x20 < 10) {
    if (uVar4 < 10) {
      uVar11 = uVar7 << 8 | uVar11;
      uVar13 = 0x1a9;
      if ((int)uVar11 < 0x2822) {
        uVar16 = (uint)bVar1;
        if (((uVar11 == 0x2422) || (uVar16 = uVar17, uVar11 == 0x2622)) || (uVar11 == 0x2624))
        goto LAB_0012261d;
      }
      else {
        if ((uVar11 == 0x2822) || (uVar11 == 0x2824)) goto LAB_0012261d;
        if (uVar11 == 0x2826) {
          uVar13 = 0x1aa;
          goto LAB_0012261d;
        }
      }
    }
    else if (((*pauVar8)[0] & 7) != 2) {
      if (uVar15 < uVar18) {
        bVar1 = bVar20;
      }
      uVar7 = (uint)bVar1;
      uVar16 = uVar7;
      if (1 < uVar11 - 0x31) {
        if (uVar11 - 0x2d < 4) {
          aStack_60._any.signature = 0x4000029;
          if (uVar7 == 1) {
            uVar13 = 0x13f;
          }
          else if (uVar7 == 2) {
            uVar13 = 0x142;
          }
          else {
            uVar13 = uVar7 == 4 ^ 0x141;
            aStack_60._any.signature = 0x8000031;
            if (uVar7 < 5) {
              aStack_60._any.signature = 0x4000029;
            }
          }
        }
        else {
          if (0x31 < uVar11 - 0x33) {
            return 4;
          }
          uVar13 = 0x1a2;
          if (cVar14 != '\0') {
            uVar13 = 0x3f5;
          }
          uVar16 = 8;
          if (uVar7 != 8) {
            uVar13 = 0x18d;
            if (cVar14 != '\0') {
              uVar13 = 0x3df;
            }
            aStack_60._any.signature = 0x4000029;
            uVar16 = uVar7;
          }
        }
        goto LAB_0012261d;
      }
      if (uVar7 != 8) {
        aStack_60._any.signature = 0x4000029;
        uVar13 = 0x18d;
        goto LAB_0012261d;
      }
LAB_0012235f:
      uVar13 = 0x1a2;
LAB_00122364:
      uVar16 = 8;
      goto LAB_0012261d;
    }
    if ((bVar20 < 5) && (bVar1 < 4)) {
      aStack_60._any.signature = 0x4000029;
      uVar13 = 0x1ad;
      uVar16 = uVar17;
      goto LAB_0012261d;
    }
    uVar16 = uVar15;
    if (uVar18 <= uVar15) {
      uVar16 = uVar18;
    }
    aStack_60._any.signature = 0x8000031;
    if (uVar16 == 4) {
      aStack_60._any.signature = 0x4000029;
    }
    uVar7 = aStack_70._any.signature & 7;
    uVar13 = 0x189;
LAB_0012245a:
    uVar5 = aStack_60._any.signature;
    if (uVar7 != 1) goto LAB_0012261d;
LAB_00122463:
    aStack_70._any.signature = uVar5;
  }
  else {
    if (uVar7 - 0x31 < 2) {
      uVar16 = (uint)bVar20;
      if ((uint)bVar1 <= (uint)bVar20) {
        uVar16 = (uint)bVar1;
      }
      if ((9 < uVar4) && ((aStack_70._any.signature & 7) != 2)) {
        uVar13 = 0x1a2;
        if ((1 < uVar11 - 0x31) && (uVar13 = 399, 0x31 < uVar11 - 0x33)) {
          return 4;
        }
        goto LAB_0012261d;
      }
      if (uVar16 == 8) goto LAB_0012235f;
      uVar7 = aStack_70._any.signature & 7;
      uVar13 = 0x18d;
joined_r0x0012269f:
      if (uVar7 != 1) goto LAB_0012261d;
    }
    else {
      if (3 < uVar7 - 0x2d) {
        if (0x31 < uVar7 - 0x33) {
          return 4;
        }
        aStack_60._any.signature = 0x10000149;
        uVar13 = 0x1a3;
        if (aStack_70._any.signature == 0x8000289) goto LAB_0012261d;
        if (TypeId::_info[(uVar9 & 0xffffffff) + 0x80] != '+' ||
            TypeId::_info[(uVar12 & 0xffffffff) + 0x80] != '*') {
          if (TypeId::_info[(uVar9 & 0xffffffff) + 0x80] == '*' &&
              TypeId::_info[(uVar12 & 0xffffffff) + 0x80] == '+') {
            uVar7 = uVar18 * 2;
            if (uVar15 <= uVar18 * 2) {
              uVar7 = (uint)bVar20;
            }
            uVar16 = uVar7 >> 1;
            uVar6 = 0x80;
            if (cVar14 != '\0') {
              uVar6 = 800;
            }
            uVar13 = 0x79;
            if (cVar14 != '\0') {
              uVar13 = 0x312;
            }
            if (uVar7 < 10) {
              uVar13 = uVar6;
            }
            uVar10 = 0x40000159;
            if ((uVar7 & 0xfe) < 0x21) {
              uVar10 = 0x20000151;
            }
            aStack_60._any.signature = 0x10000149;
            if (0x10 < (uVar7 & 0xfe)) {
              aStack_60._any.signature = uVar10;
            }
            if (((aStack_70._any.signature & 7) == 1) && (0x3f < uVar7)) {
              aStack_70._any.signature = 0x20000151;
            }
            goto LAB_0012261d;
          }
          uVar16 = uVar15;
          if (uVar18 <= uVar15) {
            uVar16 = uVar18;
          }
          if ((aStack_70._any.signature & 0xf07) == 1 || (aStack_70._any.signature & 7) == 2) {
            if (uVar16 < 5) {
              uVar13 = 0x18d;
              if (cVar14 != '\0') {
                uVar13 = 0x3df;
              }
              uVar7 = aStack_70._any.signature & 3;
              goto joined_r0x0012269f;
            }
            if (uVar16 == 8) {
              uVar13 = 0x1a2;
              if (cVar14 != '\0') {
                uVar13 = 0x3f5;
              }
              goto LAB_00122364;
            }
          }
          if ((aStack_70._any.signature & 0xf07) != 0x101 && (aStack_70._any.signature & 7) != 2) {
            return 4;
          }
          uVar13 = 0x18b;
          if (cVar14 != '\0') {
            uVar13 = 0x3de;
          }
          uVar10 = 0x40000159;
          if (uVar16 < 0x21) {
            uVar10 = 0x20000151;
          }
          aStack_60._any.signature = 0x10000149;
          if (0x10 < uVar16) {
            aStack_60._any.signature = uVar10;
          }
          uVar7 = aStack_70._any.signature & 3;
          goto LAB_0012245a;
        }
        uVar16 = uVar15 * 2;
        if (uVar18 <= uVar15 * 2) {
          uVar16 = uVar18;
        }
        uVar6 = 0x83;
        if (cVar14 != '\0') {
          uVar6 = 0x324;
        }
        uVar13 = 0x7d;
        if (cVar14 != '\0') {
          uVar13 = 0x318;
        }
        if (uVar16 < 9) {
          uVar13 = uVar6;
        }
        if ((uVar16 & 0xfe) == 0x40) {
          aStack_60._any.signature = 0x20000151;
        }
        if ((aStack_70._any.signature & 7) != 1) goto LAB_0012261d;
        uVar10 = 0x40000159;
        if (uVar16 < 0x21) {
          uVar10 = 0x20000151;
        }
        uVar5 = 0x10000149;
        if (0x10 < uVar16) {
          uVar5 = uVar10;
        }
        goto LAB_00122463;
      }
      uVar16 = uVar15;
      if (uVar18 <= uVar15) {
        uVar16 = uVar18;
      }
      if ((3 < uVar11 - 0x2d && 9 < uVar4) && ((aStack_70._any.signature & 7) != 2)) {
        return 4;
      }
      if (uVar16 == 1) {
        uVar13 = 0x13f;
      }
      else if (uVar16 == 2) {
        uVar13 = 0x142;
      }
      else {
        uVar13 = uVar16 == 4 ^ 0x141;
      }
      if (((aStack_70._any.signature & 0xf07) != 1) || (4 < uVar16)) goto LAB_0012261d;
    }
    aStack_70._any.signature = 0x4000029;
  }
LAB_0012261d:
  if ((aStack_70._any.signature & 7) == 2) {
    aStack_70._any.signature = uVar16 << 0x18 | aStack_70._any.signature & 0xfffffa;
  }
  ((CodeEmitter *)emitter)->_inlineComment = (char *)local_28._mem.field_2;
  EVar3 = CodeEmitter::emit((CodeEmitter *)emitter,uVar13,(Operand_ *)&aStack_60._any,
                            (Operand_ *)&aStack_70._any);
  return EVar3;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86Internal::emitRegMove(X86Emitter* emitter,
  const Operand_& dst_,
  const Operand_& src_, uint32_t typeId, bool avxEnabled, const char* comment) {

  // Invalid or abstract TypeIds are not allowed.
  ASMJIT_ASSERT(TypeId::isValid(typeId) && !TypeId::isAbstract(typeId));

  Operand dst(dst_);
  Operand src(src_);

  uint32_t instId = Globals::kInvalidInstId;
  uint32_t memFlags = 0;

  enum MemFlags {
    kDstMem = 0x1,
    kSrcMem = 0x2
  };

  // Detect memory operands and patch them to have the same size as the register.
  // CodeCompiler always sets memory size of allocs and spills, so it shouldn't
  // be really necessary, however, after this function was separated from Compiler
  // it's better to make sure that the size is always specified, as we can use
  // 'movzx' and 'movsx' that rely on it.
  if (dst.isMem()) { memFlags |= kDstMem; dst.as<X86Mem>().setSize(src.getSize()); }
  if (src.isMem()) { memFlags |= kSrcMem; src.as<X86Mem>().setSize(dst.getSize()); }

  switch (typeId) {
    case TypeId::kI8:
    case TypeId::kU8:
    case TypeId::kI16:
    case TypeId::kU16:
      // Special case - 'movzx' load.
      if (memFlags & kSrcMem) {
        instId = X86Inst::kIdMovzx;
        dst.setSignature(X86RegTraits<X86Reg::kRegGpd>::kSignature);
      }
      else if (!memFlags) {
        // Change both destination and source registers to GPD (safer, no dependencies).
        dst.setSignature(X86RegTraits<X86Reg::kRegGpd>::kSignature);
        src.setSignature(X86RegTraits<X86Reg::kRegGpd>::kSignature);
      }
      ASMJIT_FALLTHROUGH;

    case TypeId::kI32:
    case TypeId::kU32:
    case TypeId::kI64:
    case TypeId::kU64:
      instId = X86Inst::kIdMov;
      break;

    case TypeId::kMmx32:
      instId = X86Inst::kIdMovd;
      if (memFlags) break;
      ASMJIT_FALLTHROUGH;
    case TypeId::kMmx64 : instId = X86Inst::kIdMovq ; break;
    case TypeId::kMask8 : instId = X86Inst::kIdKmovb; break;
    case TypeId::kMask16: instId = X86Inst::kIdKmovw; break;
    case TypeId::kMask32: instId = X86Inst::kIdKmovd; break;
    case TypeId::kMask64: instId = X86Inst::kIdKmovq; break;

    default: {
      uint32_t elementTypeId = TypeId::elementOf(typeId);
      if (TypeId::isVec32(typeId) && memFlags) {
        if (elementTypeId == TypeId::kF32)
          instId = avxEnabled ? X86Inst::kIdVmovss : X86Inst::kIdMovss;
        else
          instId = avxEnabled ? X86Inst::kIdVmovd : X86Inst::kIdMovd;
        break;
      }

      if (TypeId::isVec64(typeId) && memFlags) {
        if (elementTypeId == TypeId::kF64)
          instId = avxEnabled ? X86Inst::kIdVmovsd : X86Inst::kIdMovsd;
        else
          instId = avxEnabled ? X86Inst::kIdVmovq : X86Inst::kIdMovq;
        break;
      }

      if (elementTypeId == TypeId::kF32)
        instId = avxEnabled ? X86Inst::kIdVmovaps : X86Inst::kIdMovaps;
      else if (elementTypeId == TypeId::kF64)
        instId = avxEnabled ? X86Inst::kIdVmovapd : X86Inst::kIdMovapd;
      else if (typeId <= TypeId::_kVec256End)
        instId = avxEnabled ? X86Inst::kIdVmovdqa : X86Inst::kIdMovdqa;
      else if (elementTypeId <= TypeId::kU32)
        instId = X86Inst::kIdVmovdqa32;
      else
        instId = X86Inst::kIdVmovdqa64;
      break;
    }
  }

  if (!instId)
    return DebugUtils::errored(kErrorInvalidState);

  emitter->setInlineComment(comment);
  return emitter->emit(instId, dst, src);
}